

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

void wallet::MaybeCompactWalletDB(WalletContext *context)

{
  long lVar1;
  bool bVar2;
  __int_type_conflict4 _Var3;
  uint uVar4;
  WalletDatabase *pWVar5;
  long in_FS_OFFSET;
  uint nUpdateCounter;
  WalletDatabase *dbh;
  shared_ptr<wallet::CWallet> *pwallet;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  CWallet *in_stack_ffffffffffffff88;
  __atomic_base<unsigned_int> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::atomic<bool>::exchange
                    ((atomic<bool> *)in_stack_ffffffffffffff90,
                     SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0),
                     (memory_order)in_stack_ffffffffffffff88);
  if (!bVar2) {
    GetWallets((WalletContext *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    _GLOBAL__N_1::std::
    vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::
    begin((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
           *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    _GLOBAL__N_1::std::
    vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::
    end((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
         *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    while (bVar2 = __gnu_cxx::
                   operator==<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                             ((__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                               *)in_stack_ffffffffffffff88,
                              (__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80)),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
      ::operator*((__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                   *)in_stack_ffffffffffffff78);
      std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->(in_stack_ffffffffffffff78);
      pWVar5 = CWallet::GetDatabase(in_stack_ffffffffffffff88);
      _Var3 = std::__atomic_base::operator_cast_to_unsigned_int(in_stack_ffffffffffffff90);
      if (pWVar5->nLastSeen != _Var3) {
        pWVar5->nLastSeen = _Var3;
        in_stack_ffffffffffffff90 = (__atomic_base<unsigned_int> *)GetTime();
        pWVar5->nLastWalletUpdate = (int64_t)in_stack_ffffffffffffff90;
      }
      if ((pWVar5->nLastFlushed != _Var3) &&
         (in_stack_ffffffffffffff88 = (CWallet *)GetTime(),
         1 < (long)in_stack_ffffffffffffff88 - pWVar5->nLastWalletUpdate)) {
        uVar4 = (*pWVar5->_vptr_WalletDatabase[9])();
        in_stack_ffffffffffffff87 = (undefined1)uVar4;
        if ((uVar4 & 1) != 0) {
          pWVar5->nLastFlushed = _Var3;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
      ::operator++((__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                    *)in_stack_ffffffffffffff78);
    }
    std::
    vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::
    ~vector((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
             *)in_stack_ffffffffffffff88);
    std::atomic<bool>::operator=((atomic<bool> *)in_stack_ffffffffffffff78,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void MaybeCompactWalletDB(WalletContext& context)
{
    static std::atomic<bool> fOneThread(false);
    if (fOneThread.exchange(true)) {
        return;
    }

    for (const std::shared_ptr<CWallet>& pwallet : GetWallets(context)) {
        WalletDatabase& dbh = pwallet->GetDatabase();

        unsigned int nUpdateCounter = dbh.nUpdateCounter;

        if (dbh.nLastSeen != nUpdateCounter) {
            dbh.nLastSeen = nUpdateCounter;
            dbh.nLastWalletUpdate = GetTime();
        }

        if (dbh.nLastFlushed != nUpdateCounter && GetTime() - dbh.nLastWalletUpdate >= 2) {
            if (dbh.PeriodicFlush()) {
                dbh.nLastFlushed = nUpdateCounter;
            }
        }
    }

    fOneThread = false;
}